

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O0

void shared_ownership(shared_ptr<A> *s_ptr)

{
  ostream *poVar1;
  element_type *a;
  long lVar2;
  shared_ptr<A> local_20;
  shared_ptr<A> *local_10;
  shared_ptr<A> *s_ptr_local;
  
  local_10 = s_ptr;
  poVar1 = std::operator<<((ostream *)&std::cout,"Took ownership of: ");
  a = std::__shared_ptr_access<A,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<A,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)s_ptr);
  poVar1 = operator<<(poVar1,a);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"use_count: ");
  lVar2 = std::__shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  std::operator<<(poVar1,'\n');
  std::shared_ptr<A>::shared_ptr(&local_20,s_ptr);
  shared_ownership2(&local_20);
  std::shared_ptr<A>::~shared_ptr(&local_20);
  poVar1 = std::operator<<((ostream *)&std::cout,"use_count: ");
  lVar2 = std::__shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>::use_count
                    (&s_ptr->super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,lVar2);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void shared_ownership(std::shared_ptr<A> s_ptr)
{
    std::cout << "Took ownership of: " << *s_ptr << '\n';
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
    shared_ownership2(s_ptr);
    std::cout << "use_count: " << s_ptr.use_count() << '\n';
}